

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
::has_element(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  proxy *ppVar3;
  proxy *ppVar4;
  uint uVar5;
  bool bVar6;
  ushort uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i match;
  char cVar28;
  char cVar33;
  char cVar34;
  char cVar35;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar26 = hashval >> 7;
  auVar29 = ZEXT416((CONCAT11((char)hashval,(char)hashval) & 0xff7f) & 0xffff7fff);
  auVar30 = pshuflw(auVar29,auVar29,0);
  uVar27 = 0;
  auVar29 = _DAT_001e13a0;
  while( true ) {
    uVar26 = uVar26 & uVar2;
    pcVar1 = this->ctrl_ + uVar26;
    cVar8 = *pcVar1;
    cVar9 = pcVar1[1];
    cVar10 = pcVar1[2];
    cVar11 = pcVar1[3];
    cVar12 = pcVar1[4];
    cVar13 = pcVar1[5];
    cVar14 = pcVar1[6];
    cVar15 = pcVar1[7];
    cVar16 = pcVar1[8];
    cVar17 = pcVar1[9];
    cVar18 = pcVar1[10];
    cVar19 = pcVar1[0xb];
    cVar20 = pcVar1[0xc];
    cVar21 = pcVar1[0xd];
    cVar22 = pcVar1[0xe];
    cVar23 = pcVar1[0xf];
    cVar28 = auVar30[0];
    auVar31[0] = -(cVar28 == cVar8);
    cVar33 = auVar30[1];
    auVar31[1] = -(cVar33 == cVar9);
    cVar34 = auVar30[2];
    auVar31[2] = -(cVar34 == cVar10);
    cVar35 = auVar30[3];
    auVar31[3] = -(cVar35 == cVar11);
    auVar31[4] = -(cVar28 == cVar12);
    auVar31[5] = -(cVar33 == cVar13);
    auVar31[6] = -(cVar34 == cVar14);
    auVar31[7] = -(cVar35 == cVar15);
    auVar31[8] = -(cVar28 == cVar16);
    auVar31[9] = -(cVar33 == cVar17);
    auVar31[10] = -(cVar34 == cVar18);
    auVar31[0xb] = -(cVar35 == cVar19);
    auVar31[0xc] = -(cVar28 == cVar20);
    auVar31[0xd] = -(cVar33 == cVar21);
    auVar31[0xe] = -(cVar34 == cVar22);
    auVar31[0xf] = -(cVar35 == cVar23);
    uVar7 = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf;
    if (uVar7 != 0) {
      uVar25 = (uint)uVar7;
      do {
        uVar5 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        ppVar3 = this->slots_[uVar5 + uVar26 & uVar2].mDat;
        ppVar4 = elem->mDat;
        if (ppVar4 == (proxy *)0x0 || ppVar3 == (proxy *)0x0) {
          if (ppVar3 == (proxy *)0x0 && ppVar4 == (proxy *)0x0) {
            return true;
          }
        }
        else {
          iVar24 = (*ppVar3->data->_vptr_baseHolder[4])(ppVar3->data,ppVar4->data);
          auVar29 = _DAT_001e13a0;
          if ((char)iVar24 != '\0') {
            return true;
          }
        }
        uVar25 = uVar25 - 1 & uVar25;
      } while (uVar25 != 0);
    }
    auVar32[0] = -(cVar8 == auVar29[0]);
    auVar32[1] = -(cVar9 == auVar29[1]);
    auVar32[2] = -(cVar10 == auVar29[2]);
    auVar32[3] = -(cVar11 == auVar29[3]);
    auVar32[4] = -(cVar12 == auVar29[4]);
    auVar32[5] = -(cVar13 == auVar29[5]);
    auVar32[6] = -(cVar14 == auVar29[6]);
    auVar32[7] = -(cVar15 == auVar29[7]);
    auVar32[8] = -(cVar16 == auVar29[8]);
    auVar32[9] = -(cVar17 == auVar29[9]);
    auVar32[10] = -(cVar18 == auVar29[10]);
    auVar32[0xb] = -(cVar19 == auVar29[0xb]);
    auVar32[0xc] = -(cVar20 == auVar29[0xc]);
    auVar32[0xd] = -(cVar21 == auVar29[0xd]);
    auVar32[0xe] = -(cVar22 == auVar29[0xe]);
    bVar6 = cVar23 == auVar29[0xf];
    auVar32[0xf] = -bVar6;
    if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar32 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar32 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar32 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar32 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar32 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar32 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar32 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar32 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar6) break;
    uVar26 = uVar26 + uVar27 + 0x10;
    uVar27 = uVar27 + 0x10;
    if (this->capacity_ <= uVar27) {
      __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x953,
                    "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<cs_impl::any>>::has_element(const value_type &, size_t) const [Policy = phmap::priv::FlatHashSetPolicy<cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<cs_impl::any>]"
                   );
    }
  }
  return false;
}

Assistant:

probe_seq<Group::kWidth> probe(size_t hashval) const
			{
				return probe_seq<Group::kWidth>(H1(hashval, ctrl_), capacity_);
			}